

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_update_light(player *p)

{
  short sVar1;
  _Bool _Var2;
  wchar_t wVar3;
  object *local_28;
  object *burnt;
  _Bool dummy;
  object *poStack_18;
  _Bool burn_fuel;
  object *obj;
  player *p_local;
  
  obj = (object *)p;
  poStack_18 = equipped_item_by_slot_name(p,"light");
  if ((poStack_18 != (object *)0x0) && (_Var2 = tval_is_light(poStack_18), _Var2)) {
    burnt._7_1_ = 1;
    sVar1._0_1_ = obj->tval;
    sVar1._1_1_ = obj->sval;
    wVar3 = level_topography((int)sVar1);
    if ((wVar3 != L'\a') && (_Var2 = is_daytime(), _Var2)) {
      burnt._7_1_ = 0;
    }
    _Var2 = flag_has_dbg(poStack_18->flags,6,0x19,"obj->flags","OF_NO_FUEL");
    if (_Var2) {
      burnt._7_1_ = 0;
    }
    if (((burnt._7_1_ & 1) != 0) && (0 < poStack_18->timeout)) {
      poStack_18->timeout = poStack_18->timeout + -1;
      if ((poStack_18->timeout < 100) || ((int)poStack_18->timeout % 100 == 0)) {
        *(uint *)(obj[3].brands + 0x40) = *(uint *)(obj[3].brands + 0x40) | 0x40000;
      }
      if (*(short *)(*(long *)(obj->el_info + 1) + 4) == 0) {
        if (poStack_18->timeout == 0) {
          disturb((player *)obj);
          msg("Your light has gone out!");
          _Var2 = flag_has_dbg(poStack_18->flags,6,0x17,"obj->flags","OF_BURNS_OUT");
          if (_Var2) {
            local_28 = gear_object_for_use((player *)obj,poStack_18,L'\x01',false,
                                           (_Bool *)((long)&burnt + 6));
            if (local_28->known != (object *)0x0) {
              object_delete((chunk *)obj[1].curses,(chunk *)0x0,&local_28->known);
            }
            object_delete((chunk *)cave,(chunk *)obj[1].curses,&local_28);
          }
        }
        else if ((poStack_18->timeout < 0x32) && ((int)poStack_18->timeout % 0x14 == 0)) {
          disturb((player *)obj);
          msg("Your light is growing faint.");
        }
      }
      else if (poStack_18->timeout == 0) {
        poStack_18->timeout = poStack_18->timeout + 1;
      }
    }
  }
  *(uint *)(obj[3].brands + 0x3c) = *(uint *)(obj[3].brands + 0x3c) | 2;
  return;
}

Assistant:

void player_update_light(struct player *p)
{
	/* Check for light being wielded */
	struct object *obj = equipped_item_by_slot_name(p, "light");

	/* Burn some fuel in the current light */
	if (obj && tval_is_light(obj)) {
		bool burn_fuel = true;

		/* Turn off the wanton burning of light during the day when not in a dungeon */
		if (level_topography(p->place) != TOP_CAVE && is_daytime())
			burn_fuel = false;

		/* If the light has the NO_FUEL flag, well... */
		if (of_has(obj->flags, OF_NO_FUEL))
		    burn_fuel = false;

		/* Use some fuel (except on artifacts, or during the day) */
		if (burn_fuel && obj->timeout > 0) {
			/* Decrease life-span */
			obj->timeout--;

			/* Hack -- notice interesting fuel steps */
			if ((obj->timeout < 100) || (!(obj->timeout % 100)))
				/* Redraw stuff */
				p->upkeep->redraw |= (PR_EQUIP);

			/* Hack -- Special treatment when blind */
			if (p->timed[TMD_BLIND]) {
				/* Hack -- save some light for later */
				if (obj->timeout == 0) obj->timeout++;
			} else if (obj->timeout == 0) {
				/* The light is now out */
				disturb(p);
				msg("Your light has gone out!");

				/* If it's a torch, now is the time to delete it */
				if (of_has(obj->flags, OF_BURNS_OUT)) {
					bool dummy;
					struct object *burnt =
						gear_object_for_use(p, obj, 1,
						false, &dummy);
					if (burnt->known)
						object_delete(p->cave, NULL, &burnt->known);
					object_delete(cave, p->cave, &burnt);
				}
			} else if ((obj->timeout < 50) && (!(obj->timeout % 20))) {
				/* The light is getting dim */
				disturb(p);
				msg("Your light is growing faint.");
			}
		}
	}

	/* Calculate torch radius */
	p->upkeep->update |= (PU_TORCH);
}